

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

void processingInstructionDebug(void *ctx,xmlChar *target,xmlChar *data)

{
  callbacks = callbacks + 1;
  if (noout != 0) {
    return;
  }
  if (data != (xmlChar *)0x0) {
    fprintf(_stdout,"SAX.processingInstruction(%s, %s)\n",target);
    return;
  }
  fprintf(_stdout,"SAX.processingInstruction(%s, NULL)\n",target);
  return;
}

Assistant:

static void
processingInstructionDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *target,
                      const xmlChar *data)
{
    callbacks++;
    if (noout)
	return;
    if (data != NULL)
	fprintf(stdout, "SAX.processingInstruction(%s, %s)\n",
		(char *) target, (char *) data);
    else
	fprintf(stdout, "SAX.processingInstruction(%s, NULL)\n",
		(char *) target);
}